

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tiny_gltf.h
# Opt level: O1

bool tinygltf::detail::
     ForEachInArray<tinygltf::TinyGLTF::LoadFromString(tinygltf::Model*,std::__cxx11::string*,std::__cxx11::string*,char_const*,unsigned_int,std::__cxx11::string_const&,unsigned_int)::__15>
               (json *_v,char *member,anon_class_24_3_07ed8cb9 *cb)

{
  char cVar1;
  long lVar2;
  string *err;
  char *pcVar3;
  bool bVar4;
  bool bVar5;
  int iVar6;
  reference pbVar7;
  string *psVar8;
  ostream *poVar9;
  json *extraout_RDX;
  json *extraout_RDX_00;
  json *extraout_RDX_01;
  json *extraout_RDX_02;
  json *extraout_RDX_03;
  json *extraout_RDX_04;
  json *pjVar10;
  json *extraout_RDX_05;
  json *extraout_RDX_06;
  json *extraout_RDX_07;
  double aspectRatio;
  double zfar;
  double znear;
  double yfov;
  stringstream ss;
  json_const_iterator perspIt;
  json_const_iterator itm;
  json_const_array_iterator it;
  json_const_array_iterator end;
  string_t local_630;
  double local_610;
  string *local_608;
  ios_base *local_600;
  double local_5f8;
  double local_5f0;
  double local_5e8;
  char *local_5e0;
  undefined1 local_5d8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_5c8 [7];
  ios_base aiStack_558 [272];
  json_const_iterator local_448;
  json_const_iterator local_428;
  const_iterator local_408;
  const_iterator local_3e8;
  undefined1 local_3c8 [328];
  string local_280 [32];
  double local_260;
  double local_258;
  double local_250;
  double local_248;
  ExtensionMap local_240;
  Value local_210;
  string local_178 [32];
  string local_158 [32];
  ExtensionMap local_138;
  Value local_108;
  string local_70 [32];
  string local_50 [32];
  
  local_428.m_it.array_iterator._M_current =
       (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
        *)0x0;
  local_428.m_object = (pointer)0x0;
  local_428.m_it.object_iterator._M_node = (_Base_ptr)0x0;
  local_428.m_it.primitive_iterator.m_it = -0x8000000000000000;
  local_5e0 = member;
  bVar4 = FindMember(_v,"cameras",&local_428);
  if ((bVar4) &&
     (pbVar7 = nlohmann::detail::
               iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
               ::operator*(&local_428), pbVar7->m_type == array)) {
    pbVar7 = nlohmann::detail::
             iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
             ::operator*(&local_428);
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::cbegin(&local_408,pbVar7);
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::cend(&local_3e8,pbVar7);
    bVar4 = nlohmann::detail::
            iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
            ::
            operator==<nlohmann::detail::iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_nullptr>
                      (&local_408,&local_3e8);
    if (!bVar4) {
      local_600 = aiStack_558;
      do {
        psVar8 = (string *)
                 nlohmann::detail::
                 iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                 ::operator*(&local_408);
        pcVar3 = local_5e0;
        if (*(value_t *)&(psVar8->_M_dataplus)._M_p != object) {
          if ((char *)**(undefined8 **)local_5e0 == (char *)0x0) {
            return false;
          }
          std::__cxx11::string::append((char *)**(undefined8 **)local_5e0);
          return false;
        }
        lVar2 = *(long *)(local_5e0 + 8);
        Camera::Camera((Camera *)local_3c8);
        err = (string *)**(undefined8 **)pcVar3;
        cVar1 = *(char *)(lVar2 + 0x19);
        local_5c8[0]._M_allocated_capacity._0_4_ = 0x65707974;
        local_5d8._8_8_ = (_Base_ptr)0x4;
        local_5c8[0]._M_local_buf[4] = '\0';
        local_630._M_string_length = 6;
        local_630.field_2._M_allocated_capacity._0_7_ = 0x6172656d6143;
        local_630._M_dataplus._M_p = (pointer)&local_630.field_2;
        local_608 = psVar8;
        local_5d8._0_8_ = local_5d8 + 0x10;
        bVar4 = ParseStringProperty((string *)local_3c8,err,(json *)psVar8,(string *)local_5d8,true,
                                    &local_630);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_630._M_dataplus._M_p != &local_630.field_2) {
          operator_delete(local_630._M_dataplus._M_p);
        }
        if ((undefined1 *)local_5d8._0_8_ != local_5d8 + 0x10) {
          operator_delete((void *)local_5d8._0_8_);
        }
        if (bVar4) {
          iVar6 = std::__cxx11::string::compare(local_3c8);
          if (iVar6 != 0) {
            iVar6 = std::__cxx11::string::compare(local_3c8);
            if (iVar6 == 0) {
              local_448.m_it.array_iterator._M_current =
                   (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                    *)0x0;
              local_448.m_object = (pointer)0x0;
              local_448.m_it.object_iterator._M_node = (_Base_ptr)0x0;
              local_448.m_it.primitive_iterator.m_it = -0x8000000000000000;
              bVar4 = FindMember((json *)local_608,"perspective",&local_448);
              if (bVar4) {
                psVar8 = (string *)
                         nlohmann::detail::
                         iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                         ::operator*(&local_448);
                if (*(char *)&(psVar8->_M_dataplus)._M_p == '\x01') {
                  local_5e8 = 0.0;
                  local_5d8._0_8_ = local_5d8 + 0x10;
                  local_5c8[0]._M_allocated_capacity._0_4_ = 0x766f6679;
                  local_5d8._8_8_ = (_Base_ptr)0x4;
                  local_5c8[0]._M_local_buf[4] = '\0';
                  local_630._M_dataplus._M_p = (pointer)&local_630.field_2;
                  local_610 = 8.89318162514244e-323;
                  local_630._M_dataplus._M_p =
                       (pointer)std::__cxx11::string::_M_create
                                          ((ulong *)&local_630,(ulong)&local_610);
                  local_630.field_2._M_allocated_capacity = (size_type)local_610;
                  *(undefined8 *)local_630._M_dataplus._M_p = 0x6172676f6874724f;
                  *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)local_630._M_dataplus._M_p + 8) = 'p';
                  *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)local_630._M_dataplus._M_p + 9) = 'h';
                  *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)local_630._M_dataplus._M_p + 10) = 'i';
                  *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)local_630._M_dataplus._M_p + 0xb) = 'c';
                  *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)local_630._M_dataplus._M_p + 0xc) = 'C';
                  *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)local_630._M_dataplus._M_p + 0xd) = 'a';
                  *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)local_630._M_dataplus._M_p + 0xe) = 'm';
                  *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)local_630._M_dataplus._M_p + 0xf) = 'e';
                  *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)local_630._M_dataplus._M_p + 0x10) = 'r';
                  *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)local_630._M_dataplus._M_p + 0x11) = 'a';
                  local_630._M_string_length = (size_type)local_610;
                  local_630._M_dataplus._M_p[(long)local_610] = '\0';
                  bVar4 = ParseNumberProperty(&local_5e8,err,(json *)psVar8,(string *)local_5d8,true
                                              ,&local_630);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_630._M_dataplus._M_p != &local_630.field_2) {
                    operator_delete(local_630._M_dataplus._M_p);
                  }
                  if ((undefined1 *)local_5d8._0_8_ != local_5d8 + 0x10) {
                    operator_delete((void *)local_5d8._0_8_);
                  }
                  if (bVar4) {
                    local_5f0 = 0.0;
                    local_5d8._0_8_ = local_5d8 + 0x10;
                    local_5c8[0]._M_local_buf[4] = 'r';
                    local_5c8[0]._M_allocated_capacity._0_4_ = 0x61656e7a;
                    local_5d8._8_8_ = (_Base_ptr)0x5;
                    local_5c8[0]._M_local_buf[5] = '\0';
                    local_630._M_dataplus._M_p = (pointer)&local_630.field_2;
                    local_610 = 8.39911597930119e-323;
                    local_630._M_dataplus._M_p =
                         (pointer)std::__cxx11::string::_M_create
                                            ((ulong *)&local_630,(ulong)&local_610);
                    local_630.field_2._M_allocated_capacity = (size_type)local_610;
                    *(undefined8 *)local_630._M_dataplus._M_p = 0x7463657073726550;
                    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                               *)local_630._M_dataplus._M_p + 8) = 'i';
                    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                               *)local_630._M_dataplus._M_p + 9) = 'v';
                    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                               *)local_630._M_dataplus._M_p + 10) = 'e';
                    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                               *)local_630._M_dataplus._M_p + 0xb) = 'C';
                    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                               *)local_630._M_dataplus._M_p + 0xc) = 'a';
                    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                               *)local_630._M_dataplus._M_p + 0xd) = 'm';
                    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                               *)local_630._M_dataplus._M_p + 0xe) = 'e';
                    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                               *)local_630._M_dataplus._M_p + 0xf) = 'r';
                    local_630._M_dataplus._M_p[0x10] = 'a';
                    local_630._M_string_length = (size_type)local_610;
                    local_630._M_dataplus._M_p[(long)local_610] = '\0';
                    bVar4 = ParseNumberProperty(&local_5f0,err,(json *)psVar8,(string *)local_5d8,
                                                true,&local_630);
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_630._M_dataplus._M_p != &local_630.field_2) {
                      operator_delete(local_630._M_dataplus._M_p);
                    }
                    if ((undefined1 *)local_5d8._0_8_ != local_5d8 + 0x10) {
                      operator_delete((void *)local_5d8._0_8_);
                    }
                    if (bVar4) {
                      local_610 = 0.0;
                      local_5d8._0_8_ = local_5d8 + 0x10;
                      local_5c8[0]._M_allocated_capacity._0_4_ = 0x65707361;
                      local_5c8[0]._M_local_buf[4] = 'c';
                      local_5c8[0]._M_local_buf[5] = 't';
                      local_5c8[0]._M_local_buf[6] = 'R';
                      local_5c8[0]._7_4_ = 0x6f697461;
                      local_5d8._8_8_ = (_Base_ptr)0xb;
                      local_5c8[0]._M_local_buf[0xb] = '\0';
                      local_630._M_dataplus._M_p = (pointer)&local_630.field_2;
                      std::__cxx11::string::_M_construct<char_const*>
                                ((string *)&local_630,"PerspectiveCamera","");
                      ParseNumberProperty(&local_610,err,(json *)psVar8,(string *)local_5d8,false,
                                          &local_630);
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_630._M_dataplus._M_p != &local_630.field_2) {
                        operator_delete(local_630._M_dataplus._M_p);
                      }
                      if ((undefined1 *)local_5d8._0_8_ != local_5d8 + 0x10) {
                        operator_delete((void *)local_5d8._0_8_);
                      }
                      local_5f8 = 0.0;
                      local_5d8._0_8_ = local_5d8 + 0x10;
                      local_5c8[0]._M_allocated_capacity._0_4_ = 0x7261667a;
                      local_5d8._8_8_ = (_Base_ptr)0x4;
                      local_5c8[0]._M_local_buf[4] = '\0';
                      local_630._M_dataplus._M_p = (pointer)&local_630.field_2;
                      std::__cxx11::string::_M_construct<char_const*>
                                ((string *)&local_630,"PerspectiveCamera","");
                      ParseNumberProperty(&local_5f8,err,(json *)psVar8,(string *)local_5d8,false,
                                          &local_630);
                      pjVar10 = extraout_RDX_02;
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_630._M_dataplus._M_p != &local_630.field_2) {
                        operator_delete(local_630._M_dataplus._M_p);
                        pjVar10 = extraout_RDX_03;
                      }
                      if ((undefined1 *)local_5d8._0_8_ != local_5d8 + 0x10) {
                        operator_delete((void *)local_5d8._0_8_);
                        pjVar10 = extraout_RDX_04;
                      }
                      local_3c8._64_8_ = local_610;
                      local_3c8._80_8_ = local_5f8;
                      local_3c8._72_8_ = local_5e8;
                      local_3c8._88_8_ = local_5f0;
                      ParseExtensionsProperty((ExtensionMap *)(local_3c8 + 0x60),psVar8,pjVar10);
                      ParseExtrasProperty((Value *)(local_3c8 + 0x90),(json *)psVar8);
                      if (cVar1 != '\0') {
                        local_5c8[0]._M_allocated_capacity._0_4_ = 0;
                        local_5c8[0]._M_local_buf[4] = '\0';
                        local_5c8[0]._M_local_buf[5] = '\0';
                        local_5c8[0]._M_local_buf[6] = '\0';
                        local_5d8._0_8_ = (pointer)0x0;
                        local_5d8._8_8_ = (_Base_ptr)0x0;
                        local_5c8[0]._7_4_ = 0;
                        local_5c8[0]._M_local_buf[0xb] = '\0';
                        local_5c8[0]._12_4_ = 0x80000000;
                        bVar5 = FindMember((json *)psVar8,"extensions",
                                           (json_const_iterator *)local_5d8);
                        if (bVar5) {
                          pbVar7 = nlohmann::detail::
                                   iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                   ::operator*((iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                                *)local_5d8);
                          nlohmann::
                          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                          ::dump(&local_630,pbVar7,-1,' ',false,strict);
                          std::__cxx11::string::operator=(local_280,(string *)&local_630);
                          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                               *)local_630._M_dataplus._M_p != &local_630.field_2) {
                            operator_delete(local_630._M_dataplus._M_p);
                          }
                        }
                        local_5c8[0]._M_allocated_capacity._0_4_ = 0;
                        local_5c8[0]._M_local_buf[4] = '\0';
                        local_5c8[0]._M_local_buf[5] = '\0';
                        local_5c8[0]._M_local_buf[6] = '\0';
                        local_5d8._0_8_ = (pointer)0x0;
                        local_5d8._8_8_ = (_Base_ptr)0x0;
                        local_5c8[0]._7_4_ = 0;
                        local_5c8[0]._M_local_buf[0xb] = '\0';
                        local_5c8[0]._12_4_ = 0x80000000;
                        bVar5 = FindMember((json *)psVar8,"extras",(json_const_iterator *)local_5d8)
                        ;
                        if (bVar5) {
                          pbVar7 = nlohmann::detail::
                                   iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                   ::operator*((iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                                *)local_5d8);
                          nlohmann::
                          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                          ::dump(&local_630,pbVar7,-1,' ',false,strict);
                          std::__cxx11::string::operator=
                                    ((string *)(local_3c8 + 0x128),(string *)&local_630);
                          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                               *)local_630._M_dataplus._M_p != &local_630.field_2) {
                            operator_delete(local_630._M_dataplus._M_p);
                          }
                        }
                      }
                      if (bVar4) {
LAB_0011b2d6:
                        psVar8 = local_608;
                        local_5d8._0_8_ = local_5d8 + 0x10;
                        local_5c8[0]._M_allocated_capacity._0_4_ = 0x656d616e;
                        local_5d8._8_8_ = (_Base_ptr)0x4;
                        local_5c8[0]._M_local_buf[4] = '\0';
                        local_630._M_string_length = 0;
                        local_630.field_2._M_allocated_capacity =
                             local_630.field_2._M_allocated_capacity & 0xffffffffffffff00;
                        local_630._M_dataplus._M_p = (pointer)&local_630.field_2;
                        ParseStringProperty((string *)(local_3c8 + 0x20),err,(json *)local_608,
                                            (string *)local_5d8,false,&local_630);
                        pjVar10 = extraout_RDX_05;
                        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)local_630._M_dataplus._M_p != &local_630.field_2) {
                          operator_delete(local_630._M_dataplus._M_p);
                          pjVar10 = extraout_RDX_06;
                        }
                        if ((undefined1 *)local_5d8._0_8_ != local_5d8 + 0x10) {
                          operator_delete((void *)local_5d8._0_8_);
                          pjVar10 = extraout_RDX_07;
                        }
                        ParseExtensionsProperty(&local_138,psVar8,pjVar10);
                        ParseExtrasProperty(&local_108,(json *)local_608);
                        bVar4 = true;
                        if (cVar1 != '\0') {
                          local_5c8[0]._M_allocated_capacity._0_4_ = 0;
                          local_5c8[0]._M_local_buf[4] = '\0';
                          local_5c8[0]._M_local_buf[5] = '\0';
                          local_5c8[0]._M_local_buf[6] = '\0';
                          local_5d8._0_8_ = (pointer)0x0;
                          local_5d8._8_8_ = (_Base_ptr)0x0;
                          local_5c8[0]._7_4_ = 0;
                          local_5c8[0]._M_local_buf[0xb] = '\0';
                          local_5c8[0]._12_4_ = 0x80000000;
                          bVar5 = FindMember((json *)local_608,"extensions",
                                             (json_const_iterator *)local_5d8);
                          if (bVar5) {
                            pbVar7 = nlohmann::detail::
                                     iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                     ::operator*((iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                                  *)local_5d8);
                            nlohmann::
                            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                            ::dump(&local_630,pbVar7,-1,' ',false,strict);
                            std::__cxx11::string::operator=(local_50,(string *)&local_630);
                            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                 *)local_630._M_dataplus._M_p != &local_630.field_2) {
                              operator_delete(local_630._M_dataplus._M_p);
                            }
                          }
                          local_5c8[0]._M_allocated_capacity._0_4_ = 0;
                          local_5c8[0]._M_local_buf[4] = '\0';
                          local_5c8[0]._M_local_buf[5] = '\0';
                          local_5c8[0]._M_local_buf[6] = '\0';
                          local_5d8._0_8_ = (pointer)0x0;
                          local_5d8._8_8_ = (_Base_ptr)0x0;
                          local_5c8[0]._7_4_ = 0;
                          local_5c8[0]._M_local_buf[0xb] = '\0';
                          local_5c8[0]._12_4_ = 0x80000000;
                          bVar5 = FindMember((json *)local_608,"extras",
                                             (json_const_iterator *)local_5d8);
                          if (bVar5) {
                            pbVar7 = nlohmann::detail::
                                     iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                     ::operator*((iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                                  *)local_5d8);
                            nlohmann::
                            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                            ::dump(&local_630,pbVar7,-1,' ',false,strict);
                            std::__cxx11::string::operator=(local_70,(string *)&local_630);
                            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                 *)local_630._M_dataplus._M_p != &local_630.field_2) {
                              operator_delete(local_630._M_dataplus._M_p);
                            }
                          }
                        }
                        goto LAB_0011b6ba;
                      }
                    }
                  }
                }
                else if (err != (string *)0x0) {
                  std::__cxx11::stringstream::stringstream((stringstream *)local_5d8);
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)(local_5d8 + 0x10),"\"perspective\" is not a JSON object.",
                             0x23);
                  std::ios::widen((char)*(undefined8 *)
                                         (CONCAT17(local_5c8[0]._M_local_buf[7],
                                                   CONCAT16(local_5c8[0]._M_local_buf[6],
                                                            CONCAT15(local_5c8[0]._M_local_buf[5],
                                                                     CONCAT14(local_5c8[0].
                                                                              _M_local_buf[4],
                                                                              (undefined4)
                                                                              local_5c8[0].
                                                                              _M_allocated_capacity)
                                                                    ))) + -0x18) +
                                  (char)local_5d8 + '\x10');
                  std::ostream::put((char)local_5d8 + '\x10');
                  std::ostream::flush();
                  std::__cxx11::stringbuf::str();
                  std::__cxx11::string::_M_append((char *)err,(ulong)local_630._M_dataplus._M_p);
                  goto LAB_0011b689;
                }
              }
              else if (err != (string *)0x0) {
                std::__cxx11::stringstream::stringstream((stringstream *)local_5d8);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)(local_5d8 + 0x10),"Perspective camera description not found."
                           ,0x29);
                std::ios::widen((char)*(undefined8 *)
                                       (CONCAT17(local_5c8[0]._M_local_buf[7],
                                                 CONCAT16(local_5c8[0]._M_local_buf[6],
                                                          CONCAT15(local_5c8[0]._M_local_buf[5],
                                                                   CONCAT14(local_5c8[0].
                                                                            _M_local_buf[4],
                                                                            (undefined4)
                                                                            local_5c8[0].
                                                                            _M_allocated_capacity)))
                                                ) + -0x18) + (char)local_5d8 + '\x10');
                std::ostream::put((char)local_5d8 + '\x10');
                std::ostream::flush();
                std::__cxx11::stringbuf::str();
                std::__cxx11::string::_M_append((char *)err,(ulong)local_630._M_dataplus._M_p);
                goto LAB_0011b689;
              }
            }
            else if (err != (string *)0x0) {
              std::__cxx11::stringstream::stringstream((stringstream *)local_5d8);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)(local_5d8 + 0x10),"Invalid camera type: \"",0x16);
              poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                                 ((ostream *)(local_5d8 + 0x10),(char *)local_3c8._0_8_,
                                  local_3c8._8_8_);
              std::__ostream_insert<char,std::char_traits<char>>
                        (poVar9,"\". Must be \"perspective\" or \"orthographic\"",0x2a);
              std::ios::widen((char)*(undefined8 *)(*(long *)poVar9 + -0x18) + (char)poVar9);
              std::ostream::put((char)poVar9);
              std::ostream::flush();
              std::__cxx11::stringbuf::str();
              std::__cxx11::string::_M_append((char *)err,(ulong)local_630._M_dataplus._M_p);
              goto LAB_0011b689;
            }
            goto LAB_0011b6b8;
          }
          local_448.m_it.array_iterator._M_current =
               (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                *)0x0;
          local_448.m_object = (pointer)0x0;
          local_448.m_it.object_iterator._M_node = (_Base_ptr)0x0;
          local_448.m_it.primitive_iterator.m_it = -0x8000000000000000;
          bVar4 = FindMember((json *)local_608,"orthographic",&local_448);
          if (!bVar4) {
            if (err != (string *)0x0) {
              std::__cxx11::stringstream::stringstream((stringstream *)local_5d8);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)(local_5d8 + 0x10),"Orthographic camera description not found.",
                         0x2a);
              std::ios::widen((char)*(undefined8 *)
                                     (CONCAT17(local_5c8[0]._M_local_buf[7],
                                               CONCAT16(local_5c8[0]._M_local_buf[6],
                                                        CONCAT15(local_5c8[0]._M_local_buf[5],
                                                                 CONCAT14(local_5c8[0]._M_local_buf
                                                                          [4],(undefined4)
                                                                              local_5c8[0].
                                                                              _M_allocated_capacity)
                                                                ))) + -0x18) +
                              (char)local_5d8 + '\x10');
              std::ostream::put((char)local_5d8 + '\x10');
              std::ostream::flush();
              std::__cxx11::stringbuf::str();
              std::__cxx11::string::_M_append((char *)err,(ulong)local_630._M_dataplus._M_p);
LAB_0011b689:
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_630._M_dataplus._M_p != &local_630.field_2) {
                operator_delete(local_630._M_dataplus._M_p);
              }
              std::__cxx11::stringstream::~stringstream((stringstream *)local_5d8);
              std::ios_base::~ios_base(local_600);
            }
            goto LAB_0011b6b8;
          }
          psVar8 = (string *)
                   nlohmann::detail::
                   iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                   ::operator*(&local_448);
          if (*(char *)&(psVar8->_M_dataplus)._M_p != '\x01') {
            if (err != (string *)0x0) {
              std::__cxx11::stringstream::stringstream((stringstream *)local_5d8);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)(local_5d8 + 0x10),"\"orthographic\" is not a JSON object.",0x24
                        );
              std::ios::widen((char)*(undefined8 *)
                                     (CONCAT17(local_5c8[0]._M_local_buf[7],
                                               CONCAT16(local_5c8[0]._M_local_buf[6],
                                                        CONCAT15(local_5c8[0]._M_local_buf[5],
                                                                 CONCAT14(local_5c8[0]._M_local_buf
                                                                          [4],(undefined4)
                                                                              local_5c8[0].
                                                                              _M_allocated_capacity)
                                                                ))) + -0x18) +
                              (char)local_5d8 + '\x10');
              std::ostream::put((char)local_5d8 + '\x10');
              std::ostream::flush();
              std::__cxx11::stringbuf::str();
              std::__cxx11::string::_M_append((char *)err,(ulong)local_630._M_dataplus._M_p);
              goto LAB_0011b689;
            }
            goto LAB_0011b6b8;
          }
          local_5e8 = 0.0;
          local_5d8._0_8_ = local_5d8 + 0x10;
          local_5c8[0]._M_allocated_capacity._0_4_ = 0x67616d78;
          local_5d8._8_8_ = (_Base_ptr)0x4;
          local_5c8[0]._M_local_buf[4] = '\0';
          local_630._M_dataplus._M_p = (pointer)&local_630.field_2;
          local_610 = 8.89318162514244e-323;
          local_630._M_dataplus._M_p =
               (pointer)std::__cxx11::string::_M_create((ulong *)&local_630,(ulong)&local_610);
          local_630.field_2._M_allocated_capacity = (size_type)local_610;
          *(undefined8 *)local_630._M_dataplus._M_p = 0x6172676f6874724f;
          *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_630._M_dataplus._M_p + 8) = 'p';
          *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_630._M_dataplus._M_p + 9) = 'h';
          *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_630._M_dataplus._M_p + 10) = 'i';
          *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_630._M_dataplus._M_p + 0xb) = 'c';
          *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_630._M_dataplus._M_p + 0xc) = 'C';
          *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_630._M_dataplus._M_p + 0xd) = 'a';
          *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_630._M_dataplus._M_p + 0xe) = 'm';
          *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_630._M_dataplus._M_p + 0xf) = 'e';
          *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_630._M_dataplus._M_p + 0x10) = 'r';
          *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_630._M_dataplus._M_p + 0x11) = 'a';
          local_630._M_string_length = (size_type)local_610;
          local_630._M_dataplus._M_p[(long)local_610] = '\0';
          bVar4 = ParseNumberProperty(&local_5e8,err,(json *)psVar8,(string *)local_5d8,true,
                                      &local_630);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_630._M_dataplus._M_p != &local_630.field_2) {
            operator_delete(local_630._M_dataplus._M_p);
          }
          if ((undefined1 *)local_5d8._0_8_ != local_5d8 + 0x10) {
            operator_delete((void *)local_5d8._0_8_);
          }
          if (bVar4) {
            local_5f0 = 0.0;
            local_5d8._0_8_ = local_5d8 + 0x10;
            local_5c8[0]._M_allocated_capacity._0_4_ = 0x67616d79;
            local_5d8._8_8_ = (_Base_ptr)0x4;
            local_5c8[0]._M_local_buf[4] = '\0';
            local_630._M_dataplus._M_p = (pointer)&local_630.field_2;
            local_610 = 8.89318162514244e-323;
            local_630._M_dataplus._M_p =
                 (pointer)std::__cxx11::string::_M_create((ulong *)&local_630,(ulong)&local_610);
            local_630.field_2._M_allocated_capacity = (size_type)local_610;
            *(undefined8 *)local_630._M_dataplus._M_p = 0x6172676f6874724f;
            *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_630._M_dataplus._M_p + 8) = 'p';
            *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_630._M_dataplus._M_p + 9) = 'h';
            *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_630._M_dataplus._M_p + 10) = 'i';
            *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_630._M_dataplus._M_p + 0xb) = 'c';
            *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_630._M_dataplus._M_p + 0xc) = 'C';
            *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_630._M_dataplus._M_p + 0xd) = 'a';
            *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_630._M_dataplus._M_p + 0xe) = 'm';
            *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_630._M_dataplus._M_p + 0xf) = 'e';
            *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_630._M_dataplus._M_p + 0x10) = 'r';
            *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_630._M_dataplus._M_p + 0x11) = 'a';
            local_630._M_string_length = (size_type)local_610;
            local_630._M_dataplus._M_p[(long)local_610] = '\0';
            bVar4 = ParseNumberProperty(&local_5f0,err,(json *)psVar8,(string *)local_5d8,true,
                                        &local_630);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_630._M_dataplus._M_p != &local_630.field_2) {
              operator_delete(local_630._M_dataplus._M_p);
            }
            if ((undefined1 *)local_5d8._0_8_ != local_5d8 + 0x10) {
              operator_delete((void *)local_5d8._0_8_);
            }
            if (bVar4) {
              local_5f8 = 0.0;
              local_5d8._0_8_ = local_5d8 + 0x10;
              local_5c8[0]._M_allocated_capacity._0_4_ = 0x7261667a;
              local_5d8._8_8_ = (_Base_ptr)0x4;
              local_5c8[0]._M_local_buf[4] = '\0';
              local_630._M_dataplus._M_p = (pointer)&local_630.field_2;
              local_610 = 8.89318162514244e-323;
              local_630._M_dataplus._M_p =
                   (pointer)std::__cxx11::string::_M_create((ulong *)&local_630,(ulong)&local_610);
              local_630.field_2._M_allocated_capacity = (size_type)local_610;
              *(undefined8 *)local_630._M_dataplus._M_p = 0x6172676f6874724f;
              *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_630._M_dataplus._M_p + 8) = 'p';
              *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_630._M_dataplus._M_p + 9) = 'h';
              *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_630._M_dataplus._M_p + 10) = 'i';
              *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_630._M_dataplus._M_p + 0xb) = 'c';
              *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_630._M_dataplus._M_p + 0xc) = 'C';
              *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_630._M_dataplus._M_p + 0xd) = 'a';
              *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_630._M_dataplus._M_p + 0xe) = 'm';
              *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_630._M_dataplus._M_p + 0xf) = 'e';
              *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_630._M_dataplus._M_p + 0x10) = 'r';
              *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_630._M_dataplus._M_p + 0x11) = 'a';
              local_630._M_string_length = (size_type)local_610;
              local_630._M_dataplus._M_p[(long)local_610] = '\0';
              bVar4 = ParseNumberProperty(&local_5f8,err,(json *)psVar8,(string *)local_5d8,true,
                                          &local_630);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_630._M_dataplus._M_p != &local_630.field_2) {
                operator_delete(local_630._M_dataplus._M_p);
              }
              if ((undefined1 *)local_5d8._0_8_ != local_5d8 + 0x10) {
                operator_delete((void *)local_5d8._0_8_);
              }
              if (bVar4) {
                local_610 = 0.0;
                local_5d8._0_8_ = local_5d8 + 0x10;
                local_5c8[0]._M_local_buf[4] = 'r';
                local_5c8[0]._M_allocated_capacity._0_4_ = 0x61656e7a;
                local_5d8._8_8_ = (_Base_ptr)0x5;
                local_5c8[0]._M_local_buf[5] = '\0';
                local_630._M_dataplus._M_p = (pointer)&local_630.field_2;
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)&local_630,"OrthographicCamera","");
                bVar4 = ParseNumberProperty(&local_610,err,(json *)psVar8,(string *)local_5d8,true,
                                            &local_630);
                pjVar10 = extraout_RDX;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_630._M_dataplus._M_p != &local_630.field_2) {
                  operator_delete(local_630._M_dataplus._M_p);
                  pjVar10 = extraout_RDX_00;
                }
                if ((undefined1 *)local_5d8._0_8_ != local_5d8 + 0x10) {
                  operator_delete((void *)local_5d8._0_8_);
                  pjVar10 = extraout_RDX_01;
                }
                if (bVar4) {
                  ParseExtensionsProperty(&local_240,psVar8,pjVar10);
                  ParseExtrasProperty(&local_210,(json *)psVar8);
                  if (cVar1 != '\0') {
                    local_5c8[0]._M_allocated_capacity._0_4_ = 0;
                    local_5c8[0]._M_local_buf[4] = '\0';
                    local_5c8[0]._M_local_buf[5] = '\0';
                    local_5c8[0]._M_local_buf[6] = '\0';
                    local_5d8._0_8_ = (pointer)0x0;
                    local_5d8._8_8_ = (_Base_ptr)0x0;
                    local_5c8[0]._7_4_ = 0;
                    local_5c8[0]._M_local_buf[0xb] = '\0';
                    local_5c8[0]._12_4_ = 0x80000000;
                    bVar5 = FindMember((json *)psVar8,"extensions",(json_const_iterator *)local_5d8)
                    ;
                    if (bVar5) {
                      pbVar7 = nlohmann::detail::
                               iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                               ::operator*((iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                            *)local_5d8);
                      nlohmann::
                      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                      ::dump(&local_630,pbVar7,-1,' ',false,strict);
                      std::__cxx11::string::operator=(local_158,(string *)&local_630);
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_630._M_dataplus._M_p != &local_630.field_2) {
                        operator_delete(local_630._M_dataplus._M_p);
                      }
                    }
                    local_5c8[0]._M_allocated_capacity._0_4_ = 0;
                    local_5c8[0]._M_local_buf[4] = '\0';
                    local_5c8[0]._M_local_buf[5] = '\0';
                    local_5c8[0]._M_local_buf[6] = '\0';
                    local_5d8._0_8_ = (pointer)0x0;
                    local_5d8._8_8_ = (_Base_ptr)0x0;
                    local_5c8[0]._7_4_ = 0;
                    local_5c8[0]._M_local_buf[0xb] = '\0';
                    local_5c8[0]._12_4_ = 0x80000000;
                    bVar5 = FindMember((json *)psVar8,"extras",(json_const_iterator *)local_5d8);
                    if (bVar5) {
                      pbVar7 = nlohmann::detail::
                               iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                               ::operator*((iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                            *)local_5d8);
                      nlohmann::
                      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                      ::dump(&local_630,pbVar7,-1,' ',false,strict);
                      std::__cxx11::string::operator=(local_178,(string *)&local_630);
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_630._M_dataplus._M_p != &local_630.field_2) {
                        operator_delete(local_630._M_dataplus._M_p);
                      }
                    }
                  }
                  local_260 = local_5e8;
                  local_258 = local_5f0;
                  local_250 = local_5f8;
                  local_248 = local_610;
                  if (bVar4) goto LAB_0011b2d6;
                }
                goto LAB_0011b6b8;
              }
            }
          }
          bVar4 = false;
        }
        else {
LAB_0011b6b8:
          bVar4 = false;
        }
LAB_0011b6ba:
        if (!bVar4) {
          Camera::~Camera((Camera *)local_3c8);
          return false;
        }
        std::vector<tinygltf::Camera,_std::allocator<tinygltf::Camera>_>::
        emplace_back<tinygltf::Camera>
                  ((vector<tinygltf::Camera,_std::allocator<tinygltf::Camera>_> *)
                   (**(long **)(local_5e0 + 0x10) + 0x108),(Camera *)local_3c8);
        Camera::~Camera((Camera *)local_3c8);
        if (!bVar4) {
          return false;
        }
        nlohmann::detail::
        iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
        ::operator++(&local_408);
        bVar4 = nlohmann::detail::
                iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                ::
                operator==<nlohmann::detail::iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_nullptr>
                          (&local_408,&local_3e8);
      } while (!bVar4);
    }
  }
  return true;
}

Assistant:

bool ForEachInArray(const detail::json &_v, const char *member, Callback &&cb) {
  detail::json_const_iterator itm;
  if (detail::FindMember(_v, member, itm) &&
      detail::IsArray(detail::GetValue(itm))) {
    const detail::json &root = detail::GetValue(itm);
    auto it = detail::ArrayBegin(root);
    auto end = detail::ArrayEnd(root);
    for (; it != end; ++it) {
      if (!cb(*it)) return false;
    }
  }
  return true;
}